

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O0

optional<metaf::Pressure> metaf::Pressure::fromQfeString(string *s)

{
  _Optional_base<metaf::Pressure,_true,_true> _Var1;
  bool bVar2;
  long lVar3;
  char *pcVar4;
  _Optional_payload_base<unsigned_int> this;
  ulong in_RDI;
  Pressure pressure;
  optional<unsigned_int> hPa;
  optional<unsigned_int> mmHg;
  Pressure *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 uVar5;
  _Optional_payload_base<unsigned_int> in_stack_ffffffffffffffd8;
  _Optional_payload_base<float> local_10;
  undefined8 local_8;
  
  lVar3 = std::__cxx11::string::length();
  if ((lVar3 == 6) || (lVar3 = std::__cxx11::string::length(), lVar3 == 0xb)) {
    pcVar4 = (char *)std::__cxx11::string::operator[](in_RDI);
    if (((*pcVar4 == 'Q') &&
        (pcVar4 = (char *)std::__cxx11::string::operator[](in_RDI), *pcVar4 == 'F')) &&
       (pcVar4 = (char *)std::__cxx11::string::operator[](in_RDI), *pcVar4 == 'E')) {
      this = (_Optional_payload_base<unsigned_int>)
             strToUint((string *)
                       mmHg.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                       super__Optional_payload_base<unsigned_int>,
                       (size_t)hPa.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                               super__Optional_payload_base<unsigned_int>,pressure._4_8_);
      bVar2 = std::optional<unsigned_int>::has_value((optional<unsigned_int> *)0x25ab88);
      if (bVar2) {
        lVar3 = std::__cxx11::string::length();
        if (lVar3 == 0xb) {
          in_stack_ffffffffffffffd8 =
               (_Optional_payload_base<unsigned_int>)
               strToUint((string *)
                         mmHg.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                         super__Optional_payload_base<unsigned_int>,
                         (size_t)hPa.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                                 super__Optional_payload_base<unsigned_int>,pressure._4_8_);
          bVar2 = std::optional<unsigned_int>::has_value((optional<unsigned_int> *)0x25abdc);
          if ((!bVar2) ||
             (pcVar4 = (char *)std::__cxx11::string::operator[](in_RDI), *pcVar4 != '/')) {
            local_10 = (_Optional_payload_base<float>)0;
            local_8 = 0;
            goto LAB_0025ac4d;
          }
        }
        Pressure((Pressure *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
        uVar5 = 2;
        std::optional<unsigned_int>::operator*((optional<unsigned_int> *)0x25ac31);
        std::optional<float>::operator=((optional<float> *)this,(uint *)in_stack_ffffffffffffffd8);
        std::optional<metaf::Pressure>::optional<metaf::Pressure,_true>
                  ((optional<metaf::Pressure> *)CONCAT44(uVar5,in_stack_ffffffffffffffd0),
                   in_stack_ffffffffffffffc8);
      }
      else {
        local_10 = (_Optional_payload_base<float>)0;
        local_8 = 0;
      }
    }
    else {
      local_10 = (_Optional_payload_base<float>)0;
      local_8 = 0;
    }
  }
  else {
    local_10 = (_Optional_payload_base<float>)0;
    local_8 = 0;
  }
LAB_0025ac4d:
  _Var1._M_payload.super__Optional_payload_base<metaf::Pressure>._8_8_ = local_8;
  _Var1._M_payload.super__Optional_payload_base<metaf::Pressure>._M_payload._M_value.pressureValue.
  super__Optional_base<float,_true,_true>._M_payload.super__Optional_payload_base<float> =
       (optional<float>)(optional<float>)local_10;
  return (_Optional_base<metaf::Pressure,_true,_true>)
         (_Optional_base<metaf::Pressure,_true,_true>)
         _Var1._M_payload.super__Optional_payload_base<metaf::Pressure>;
}

Assistant:

std::optional<Pressure> Pressure::fromQfeString(const std::string & s) {
	//static const std::regex rgx("QFE(\\d\\d\\d)(/\\d\\d\\d\\d)?");
	static const std::optional<Pressure> error;
	if (s.length() != 6 && s.length() != 11) return error;
	if (s[0] != 'Q' || s[1] != 'F' || s[2] != 'E') return error;
	const auto mmHg = strToUint(s, 3, 3);
	if (!mmHg.has_value()) return error;
	if (s.length() == 11) {
		const auto hPa = strToUint(s, 7, 4);
		if (!hPa.has_value() || s[6] != '/') return error;
		//Value in hPa is ignored (parsed only for group syntax check)
	}
	Pressure pressure;
	pressure.pressureUnit = Unit::MM_HG;
	pressure.pressureValue = *mmHg;
	return pressure;
}